

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_or(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  roaring64_bitmap_t *prVar1;
  void *c2;
  container_t *pcVar2;
  bool bVar3;
  bool bVar4;
  leaf_t *result_leaf_2;
  leaf_t *result_leaf_1;
  leaf_t *result_leaf;
  leaf_t *leaf2;
  leaf_t *leaf1;
  int compare_result;
  _Bool it2_present;
  _Bool it1_present;
  art_iterator_t it2;
  art_iterator_t it1;
  roaring64_bitmap_t *result;
  art_key_chunk_t *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 uVar5;
  leaf_t *in_stack_fffffffffffffea8;
  leaf_t *in_stack_fffffffffffffeb0;
  long lVar6;
  int local_130;
  long local_120;
  container_t *local_98;
  
  prVar1 = roaring64_bitmap_create();
  art_init_iterator((art_t *)in_stack_fffffffffffffeb0,
                    SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
  art_init_iterator((art_t *)in_stack_fffffffffffffeb0,
                    SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
  while (uVar5 = local_98 != (container_t *)0x0 || local_120 != 0,
        local_98 != (container_t *)0x0 || local_120 != 0) {
    bVar3 = local_98 != (container_t *)0x0;
    bVar4 = local_120 != 0;
    local_130 = 0;
    if (((bVar3) && (bVar4)) &&
       (local_130 = compare_high48((art_key_chunk_t *)CONCAT17(uVar5,in_stack_fffffffffffffea0),
                                   in_stack_fffffffffffffe98), local_130 == 0)) {
      lVar6 = local_120;
      pcVar2 = local_98;
      c2 = roaring_malloc(0x108701);
      pcVar2 = container_or(pcVar2,(uint8_t)((ulong)lVar6 >> 0x38),c2,
                            (uint8_t)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                            (uint8_t *)in_stack_fffffffffffffea8);
      *(container_t **)((long)c2 + 8) = pcVar2;
      art_insert((art_t *)in_stack_fffffffffffffeb0,(art_key_chunk_t *)in_stack_fffffffffffffea8,
                 (art_val_t *)CONCAT17(uVar5,in_stack_fffffffffffffea0));
      art_iterator_next((art_iterator_t *)0x10876f);
      art_iterator_next((art_iterator_t *)0x108779);
    }
    if (((bVar3) && (!bVar4)) || (local_130 < 0)) {
      in_stack_fffffffffffffeb0 =
           copy_leaf_container((leaf_t *)CONCAT17(uVar5,in_stack_fffffffffffffea0));
      art_insert((art_t *)in_stack_fffffffffffffeb0,(art_key_chunk_t *)in_stack_fffffffffffffea8,
                 (art_val_t *)CONCAT17(uVar5,in_stack_fffffffffffffea0));
      art_iterator_next((art_iterator_t *)0x1087c9);
    }
    else if (((!bVar3) && (bVar4)) || (0 < local_130)) {
      in_stack_fffffffffffffea8 =
           copy_leaf_container((leaf_t *)CONCAT17(uVar5,in_stack_fffffffffffffea0));
      art_insert((art_t *)in_stack_fffffffffffffeb0,(art_key_chunk_t *)in_stack_fffffffffffffea8,
                 (art_val_t *)CONCAT17(uVar5,in_stack_fffffffffffffea0));
      art_iterator_next((art_iterator_t *)0x108810);
    }
  }
  return prVar1;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_or(const roaring64_bitmap_t *r1,
                                        const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                result_leaf->container = container_or(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);
                art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it2.value);
            art_insert(&result->art, it2.key, (art_val_t *)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}